

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O0

int Bac_GetTypeId(Bac_ObjType_t Type)

{
  int local_14;
  int i;
  Bac_ObjType_t Type_local;
  
  local_14 = 1;
  while( true ) {
    if (0x48 < local_14) {
      return -1;
    }
    if (s_Types[local_14].Type == Type) break;
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

static inline int Bac_GetTypeId( Bac_ObjType_t Type )
{
    int i;
    for ( i = 1; i < BAC_BOX_UNKNOWN; i++ )
        if ( s_Types[i].Type == Type )
            return i;
    return -1;
}